

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O1

void ym2612_reset_chip(void *chip)

{
  FM_OPN *OPN;
  long lVar1;
  undefined4 *puVar2;
  UINT8 *pUVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  
  if (*(uint *)((long)chip + 0x224) == 0) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = ((double)*(uint *)((long)chip + 0x220) / (double)*(uint *)((long)chip + 0x224)) / 144.0;
  }
  OPN = (FM_OPN *)((long)chip + 0x200);
  *(double *)((long)chip + 0x210) = dVar8;
  *(int *)((long)chip + 0x6c0) = (int)(long)(dVar8 * 65536.0);
  *(undefined4 *)((long)chip + 0x6c4) = 0x30000;
  *(int *)((long)chip + 0x46d4) = (int)(long)(dVar8 * 16777216.0);
  *(undefined4 *)((long)chip + 0x218) = 0x90;
  lVar1 = (long)chip + 0x444;
  pUVar3 = "";
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      iVar7 = (int)((double)pUVar3[lVar6] * dVar8 * 64.0);
      *(int *)(lVar1 + -0x200 + lVar6 * 4) = iVar7;
      *(int *)(lVar1 + lVar6 * 4) = -iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    lVar4 = lVar4 + 1;
    lVar1 = lVar1 + 0x80;
    pUVar3 = pUVar3 + 0x20;
  } while (lVar4 != 4);
  puVar2 = (undefined4 *)((long)chip + 0x6c8);
  lVar1 = 0;
  do {
    *puVar2 = (int)(long)((double)(int)lVar1 * dVar8 * 64.0);
    lVar1 = lVar1 + 0x20;
    puVar2 = puVar2 + 1;
  } while (lVar1 != 0x20000);
  *(int *)((long)chip + 0x46c8) = (int)(long)(dVar8 * 131072.0 * 64.0);
  *(undefined1 *)((long)chip + 0x21d) = 3;
  if ((*(char *)((long)chip + 0x21c) == '\0') && ((*(byte *)((long)chip + 0x229) & 3) != 0)) {
    *(undefined1 *)((long)chip + 0x21c) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x208));
    }
  }
  if ((*(char *)((long)chip + 0x21c) != '\0') &&
     ((*(byte *)((long)chip + 0x229) & *(byte *)((long)chip + 0x21d)) == 0)) {
    *(undefined1 *)((long)chip + 0x21c) = 0;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x208));
    }
  }
  *(undefined8 *)((long)chip + 0x6b8) = 0;
  *(undefined4 *)((long)chip + 0x46d0) = 0;
  *(undefined1 *)((long)chip + 0x46cc) = 0;
  *(undefined8 *)((long)chip + 0x46dc) = 0x7e;
  *(undefined4 *)((long)chip + 0x238) = 0;
  *(undefined4 *)((long)chip + 0x240) = 0;
  *(undefined1 *)((long)chip + 0x67c) = 0;
  *(undefined1 *)((long)chip + 0x229) = 0;
  *(undefined4 *)((long)chip + 0x22c) = 0;
  memset(chip,0,0x200);
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined4 *)((long)chip + 0x46d0) = 0;
  *(undefined1 *)((long)chip + 0x46cc) = 0;
  *(undefined8 *)((long)chip + 0x46dc) = 0x7e;
  OPNWriteMode(OPN,0x27,0x30);
  *(undefined1 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x234) = 0;
  lVar1 = (long)chip + 0x475a;
  lVar4 = 0;
  do {
    lVar6 = lVar4 * 0x1a0;
    *(undefined4 *)((long)chip + lVar6 + 0x4888) = 0;
    *(undefined8 *)((long)chip + lVar6 + 0x4854) = 0;
    *(undefined4 *)((long)chip + lVar6 + 0x4894) = 0;
    lVar6 = 0;
    do {
      *(undefined1 *)(lVar1 + lVar6) = 0;
      *(undefined8 *)(lVar1 + -0x26 + lVar6) = 0xffffffff00000000;
      *(undefined2 *)(lVar1 + -2 + lVar6) = 0;
      *(undefined1 *)(lVar1 + -0x1e + lVar6) = 0;
      *(undefined4 *)(lVar1 + -0x16 + lVar6) = 0x3ff;
      *(undefined4 *)(lVar1 + -0xe + lVar6) = 0x3ff;
      lVar6 = lVar6 + 0x50;
    } while (lVar6 != 0x140);
    lVar4 = lVar4 + 1;
    lVar1 = lVar1 + 0x1a0;
  } while (lVar4 != 6);
  uVar5 = 0xb7;
  do {
    uVar5 = uVar5 - 1;
    OPNWriteReg(OPN,uVar5,0xc0);
    OPNWriteReg(OPN,uVar5 | 0x100,0xc0);
  } while (0xb4 < uVar5);
  uVar5 = 0xb3;
  do {
    uVar5 = uVar5 - 1;
    OPNWriteReg(OPN,uVar5,0);
    OPNWriteReg(OPN,uVar5 | 0x100,0);
  } while (0x30 < uVar5);
  *(undefined2 *)((long)chip + 0x50d1) = 0;
  *(undefined4 *)((long)chip + 0x50d4) = 0;
  if (*(char *)((long)chip + 0x50d9) == '\x02') {
    *(undefined1 *)((long)chip + 0x50d9) = 1;
  }
  return;
}

Assistant:

void ym2612_reset_chip(void *chip)
{
	int i;
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN *OPN   = &F2612->OPN;

	OPNSetPres( OPN, 6*24, 6*24, 0);
	/* status clear */
	FM_IRQMASK_SET(&OPN->ST,0x03);
	FM_BUSY_CLEAR(&OPN->ST);
	/* OPNWriteMode(OPN,0x27,0x30); */ /* mode 0 , timer reset */

#if RSM_ENABLE
	/* Resampler's state */
	F2612->OPN.ST.framecnt = 1 << RSM_FRAC;
	memset(&(F2612->OPN.ST.cur_sample), 0x00, sizeof(FMSAMPLE) * 2);
	memset(&(F2612->OPN.ST.prev_sample), 0x00, sizeof(FMSAMPLE) * 2);
#endif

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->lfo_timer = 0;
	OPN->lfo_cnt   = 0;
	OPN->LFO_AM    = 126;
	OPN->LFO_PM    = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;

	memset(F2612->REGS, 0x00, sizeof(UINT8) * 512);

	OPNWriteMode(OPN,0x22,0x00);

	OPNWriteMode(OPN,0x27,0x30);
	OPNWriteMode(OPN,0x26,0x00);
	OPNWriteMode(OPN,0x25,0x00);
	OPNWriteMode(OPN,0x24,0x00);

	reset_channels( &OPN->ST , &F2612->CH[0] , 6 );

	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}

	/* DAC mode clear */
	F2612->dacen = 0;
	F2612->dac_test = 0;
	F2612->dacout = 0;

	if (F2612->WaveOutMode == 0x02)
		F2612->WaveOutMode >>= 1;
}